

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  int len;
  xmlEntityPtr entity;
  xmlChar *pxVar1;
  xmlEntityPtr in_stack_fffffffffffffff0;
  
  if ((doc != (xmlDocPtr)0x0) && (doc->intSubset != (_xmlDtd *)0x0)) {
    xmlAddEntity(doc,0,name,type,ExternalID,SystemID,content,
                 (xmlEntityPtr *)&stack0xfffffffffffffff0);
    return in_stack_fffffffffffffff0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  entity = (xmlEntityPtr)(*xmlMalloc)(0x90);
  if (entity == (xmlEntityPtr)0x0) {
    return (xmlEntityPtr)0x0;
  }
  memset(entity,0,0x90);
  entity->doc = doc;
  entity->type = XML_ENTITY_DECL;
  entity->etype = type;
  if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
    pxVar1 = xmlStrdup(name);
  }
  else {
    pxVar1 = xmlDictLookup(doc->dict,name,-1);
  }
  entity->name = pxVar1;
  if (pxVar1 == (xmlChar *)0x0) {
LAB_0012e4af:
    xmlFreeEntity(entity);
    return (xmlEntityPtr)0x0;
  }
  if (ExternalID != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(ExternalID);
    entity->ExternalID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012e4af;
  }
  if (SystemID != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(SystemID);
    entity->SystemID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012e4af;
  }
  if (content == (xmlChar *)0x0) {
    entity->length = 0;
    entity->content = (xmlChar *)0x0;
  }
  else {
    len = xmlStrlen(content);
    entity->length = len;
    pxVar1 = xmlStrndup(content,len);
    entity->content = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012e4af;
  }
  entity->URI = (xmlChar *)0x0;
  entity->orig = (xmlChar *)0x0;
  return entity;
}

Assistant:

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc, const xmlChar *name, int type,
	     const xmlChar *ExternalID, const xmlChar *SystemID,
	     const xmlChar *content) {
    if ((doc != NULL) && (doc->intSubset != NULL)) {
	return(xmlAddDocEntity(doc, name, type, ExternalID, SystemID, content));
    }
    if (name == NULL)
        return(NULL);
    return(xmlCreateEntity(doc, name, type, ExternalID, SystemID, content));
}